

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3_print.h
# Opt level: O0

int grisu3_round_weed(char *buffer,int len,uint64_t wp_W,uint64_t delta,uint64_t rest,
                     uint64_t ten_kappa,uint64_t ulp)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  bool local_53;
  uint64_t wp_Wdown;
  uint64_t wp_Wup;
  uint64_t ten_kappa_local;
  uint64_t rest_local;
  uint64_t delta_local;
  uint64_t wp_W_local;
  int len_local;
  char *buffer_local;
  
  uVar1 = wp_W - ulp;
  uVar2 = wp_W + ulp;
  ten_kappa_local = rest;
  while( true ) {
    bVar3 = false;
    if (((ten_kappa_local < uVar1) && (bVar3 = false, ten_kappa <= delta - ten_kappa_local)) &&
       (bVar3 = true, uVar1 <= ten_kappa_local + ten_kappa)) {
      bVar3 = (ten_kappa_local + ten_kappa) - uVar1 <= uVar1 - ten_kappa_local;
    }
    if (!bVar3) break;
    buffer[len + -1] = buffer[len + -1] + -1;
    ten_kappa_local = ten_kappa + ten_kappa_local;
  }
  if (((ten_kappa_local < uVar2) && (ten_kappa <= delta - ten_kappa_local)) &&
     ((ten_kappa_local + ten_kappa < uVar2 ||
      ((ten_kappa_local + ten_kappa) - uVar2 < uVar2 - ten_kappa_local)))) {
    buffer_local._4_4_ = 0;
  }
  else {
    local_53 = (ulp * 2 < ten_kappa_local || ulp * 2 - ten_kappa_local == 0) &&
               ten_kappa_local <= delta + ulp * -4;
    buffer_local._4_4_ = (uint)local_53;
  }
  return buffer_local._4_4_;
}

Assistant:

static int grisu3_round_weed(char *buffer, int len, uint64_t wp_W, uint64_t delta, uint64_t rest, uint64_t ten_kappa, uint64_t ulp)
{
    uint64_t wp_Wup = wp_W - ulp;
    uint64_t wp_Wdown = wp_W + ulp;
    while(rest < wp_Wup && delta - rest >= ten_kappa
        && (rest + ten_kappa < wp_Wup || wp_Wup - rest >= rest + ten_kappa - wp_Wup))
    {
        --buffer[len-1];
        rest += ten_kappa;
    }
    if (rest < wp_Wdown && delta - rest >= ten_kappa
        && (rest + ten_kappa < wp_Wdown || wp_Wdown - rest > rest + ten_kappa - wp_Wdown))
        return 0;

    return 2*ulp <= rest && rest <= delta - 4*ulp;
}